

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O2

string * __thiscall
(anonymous_namespace)::ValueToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *value)

{
  allocator<char> local_9;
  
  if (this == (_anonymous_namespace_ *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)this,&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ValueToString(const char* const value)
{
  return value ? value : std::string{};
}